

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

Array<asl::InetAddress> __thiscall asl::InetAddress::lookup(InetAddress *this,String *host)

{
  int *piVar1;
  socklen_t m;
  bool bVar2;
  uint uVar3;
  int iVar4;
  addrinfo *paVar5;
  long lVar6;
  anon_union_16_2_78e7fdac_for_String_2 *__name;
  InetAddress *this_00;
  InetAddress a;
  addrinfo *info;
  addrinfo hints;
  InetAddress local_80;
  addrinfo *local_70;
  addrinfo local_68;
  
  Array<asl::InetAddress>::alloc((Array<asl::InetAddress> *)this,0);
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_socktype = 0;
  local_68.ai_protocol = 0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  uVar3 = String::indexOf(host,':',0);
  local_68.ai_family = ((int)~uVar3 >> 0x1f) * -8 + 2;
  if (host->_size == 0) {
    __name = &host->field_2;
  }
  else {
    __name = (anon_union_16_2_78e7fdac_for_String_2 *)(host->field_2)._str;
  }
  iVar4 = getaddrinfo(__name->_space,(char *)0x0,&local_68,&local_70);
  if (iVar4 == 0) {
    if (local_70 != (addrinfo *)0x0) {
      paVar5 = local_70;
      do {
        Array<unsigned_char>::alloc(&local_80._data,0);
        local_80._type = (paVar5->ai_family != 2) + IPv4;
        m = paVar5->ai_addrlen;
        Array<unsigned_char>::reserve(&local_80._data,m);
        *(socklen_t *)(local_80._data._a + -0x10) = m;
        memcpy(local_80._data._a,paVar5->ai_addr,(ulong)paVar5->ai_addrlen);
        this_00 = (InetAddress *)(this->_data)._a;
        lVar6 = (long)*(int *)&this_00[-1]._data._a;
        if (0 < lVar6) {
          do {
            bVar2 = operator==(this_00,&local_80);
            if (bVar2) goto LAB_0011ce3a;
            this_00 = this_00 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        Array<asl::InetAddress>::insert
                  ((Array<asl::InetAddress> *)this,-(uint)(local_80._type != IPv4),&local_80);
LAB_0011ce3a:
        LOCK();
        piVar1 = (int *)(local_80._data._a + -8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          free(local_80._data._a + -0x10);
          local_80._data._a = (uchar *)0x0;
        }
        paVar5 = paVar5->ai_next;
      } while (paVar5 != (addrinfo *)0x0);
    }
    freeaddrinfo(local_70);
  }
  return (Array<asl::InetAddress>)this;
}

Assistant:

Array<InetAddress> InetAddress::lookup(const String& host)
{
#ifdef _WIN32
	if (!g_wsaStarted) startWSA();
#endif
	Array<InetAddress> addresses;
	addrinfo hints;
	addrinfo* info;
	memset(&hints, 0, sizeof(addrinfo));
	hints.ai_family = host.contains(':') ? AF_INET6 : AF_TYPE;

	int s = getaddrinfo(host, NULL, &hints, &info);
	if (s != 0)
	{
		verbose_print("Cannot resolve %s\n", *host);
		return addresses;
	}
	for (const addrinfo* ai = info; ai; ai = ai->ai_next)
	{
		InetAddress a;
		if (ai->ai_family == AF_INET)
			a._type = IPv4;
		else
			a._type = IPv6;
		a.resize((int)ai->ai_addrlen);
		memcpy(a.ptr(), ai->ai_addr, ai->ai_addrlen);
		if (!addresses.contains(a))
		{
			if (a._type == IPv4)
				addresses.insert(0, a);
			else
				addresses << a;
		}
	}
	freeaddrinfo(info);
	return addresses;
}